

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * str_hasnextword(char *buffer,char *word)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  bool bVar4;
  char *local_20;
  char *word_local;
  char *buffer_local;
  
  word_local = buffer;
  if (buffer == (char *)0x0) {
    buffer_local = (char *)0x0;
  }
  else {
    while (ppuVar3 = __ctype_b_loc(), local_20 = word, ((*ppuVar3)[(int)*word_local] & 1) != 0) {
      word_local = word_local + 1;
    }
    while( true ) {
      bVar4 = false;
      if ((*local_20 != '\0') && (bVar4 = false, *word_local != '\0')) {
        ppuVar3 = __ctype_b_loc();
        bVar4 = false;
        if (((*ppuVar3)[(int)*word_local] & 1) == 0) {
          iVar1 = tolower((int)*local_20);
          iVar2 = tolower((int)*word_local);
          bVar4 = iVar1 == iVar2;
        }
      }
      if (!bVar4) break;
      local_20 = local_20 + 1;
      word_local = word_local + 1;
    }
    if ((*local_20 == '\0') &&
       ((*word_local == '\0' || (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*word_local] & 1) != 0)
        ))) {
      while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*word_local] & 1) != 0) {
        word_local = word_local + 1;
      }
      buffer_local = word_local;
    }
    else {
      buffer_local = (char *)0x0;
    }
  }
  return buffer_local;
}

Assistant:

const char *
str_hasnextword(const char *buffer, const char *word) {
  /* sanity check */
  if (buffer == NULL) {
    return NULL;
  }

  /* skip whitespace prefix */
  while (isblank(*buffer)) {
    buffer++;
  }

  while (*word != 0 && *buffer != 0 && !isblank(*buffer) && tolower(*word) == tolower(*buffer)) {
    word++;
    buffer++;
  }

  /* complete match ? */
  if (*word == 0 && (*buffer == 0 || isblank(*buffer))) {
    while (isblank(*buffer)) {
      buffer++;
    }
    return buffer;
  }
  return NULL;
}